

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O0

_Bool portfwdmgr_listen(PortFwdManager *mgr,char *host,int port,char *keyhost,int keyport,Conf *conf
                       )

{
  PortFwdRecord *pfr_00;
  PortFwdRecord *pPVar1;
  char *ptr;
  char *pcVar2;
  char *pcVar3;
  char *local_98;
  char *local_68;
  char *local_60;
  char *err;
  PortFwdRecord *existing;
  PortFwdRecord *pfr;
  Conf *conf_local;
  int keyport_local;
  char *keyhost_local;
  int port_local;
  char *host_local;
  PortFwdManager *mgr_local;
  
  pfr_00 = (PortFwdRecord *)safemalloc(1,0x48,0);
  pfr_00->type = 0x4c;
  if (host == (char *)0x0) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = dupstr(host);
  }
  pfr_00->saddr = local_60;
  if (keyhost == (char *)0x0) {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = dupstr(keyhost);
  }
  pfr_00->daddr = local_68;
  pfr_00->dserv = (char *)0x0;
  pfr_00->sserv = (char *)0x0;
  pfr_00->sport = port;
  pfr_00->dport = keyport;
  pfr_00->local = (PortListener *)0x0;
  pfr_00->remote = (ssh_rportfwd *)0x0;
  pfr_00->addressfamily = 0;
  pPVar1 = (PortFwdRecord *)add234(mgr->forwardings,pfr_00);
  if (pPVar1 == pfr_00) {
    ptr = pfl_listen(keyhost,keyport,host,port,mgr->cl,conf,&pfr_00->local,pfr_00->addressfamily);
    pcVar2 = "Listening";
    if (ptr != (char *)0x0) {
      pcVar2 = "Failed to listen";
    }
    pcVar3 = anon_var_dwarf_248df + 10;
    if (ptr == (char *)0x0) {
      local_98 = anon_var_dwarf_248df + 10;
    }
    else {
      pcVar3 = ": ";
      local_98 = ptr;
    }
    logeventf(mgr->cl->logctx,"%s on port %s:%d to forward to client%s%s",pcVar2,host,
              (ulong)(uint)port,pcVar3,local_98);
    if (ptr == (char *)0x0) {
      mgr_local._7_1_ = true;
    }
    else {
      safefree(ptr);
      del234(mgr->forwardings,pfr_00);
      pfr_free(pfr_00);
      mgr_local._7_1_ = false;
    }
  }
  else {
    pfr_free(pfr_00);
    mgr_local._7_1_ = false;
  }
  return mgr_local._7_1_;
}

Assistant:

bool portfwdmgr_listen(PortFwdManager *mgr, const char *host, int port,
                       const char *keyhost, int keyport, Conf *conf)
{
    PortFwdRecord *pfr;

    pfr = snew(PortFwdRecord);
    pfr->type = 'L';
    pfr->saddr = host ? dupstr(host) : NULL;
    pfr->daddr = keyhost ? dupstr(keyhost) : NULL;
    pfr->sserv = pfr->dserv = NULL;
    pfr->sport = port;
    pfr->dport = keyport;
    pfr->local = NULL;
    pfr->remote = NULL;
    pfr->addressfamily = ADDRTYPE_UNSPEC;

    PortFwdRecord *existing = add234(mgr->forwardings, pfr);
    if (existing != pfr) {
        /*
         * We had this record already. Return failure.
         */
        pfr_free(pfr);
        return false;
    }

    char *err = pfl_listen(keyhost, keyport, host, port,
                           mgr->cl, conf, &pfr->local, pfr->addressfamily);
    logeventf(mgr->cl->logctx,
              "%s on port %s:%d to forward to client%s%s",
              err ? "Failed to listen" : "Listening", host, port,
              err ? ": " : "", err ? err : "");
    if (err) {
        sfree(err);
        del234(mgr->forwardings, pfr);
        pfr_free(pfr);
        return false;
    }

    return true;
}